

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_bit.cpp
# Opt level: O0

ssize_t cornelich::util::stop_bit::read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ulong uVar2;
  logic_error *plVar3;
  undefined4 in_register_0000003c;
  int local_34;
  int count;
  int64_t b;
  int64_t l;
  int32_t *offset_local;
  uint8_t *buffer_local;
  
  iVar1 = *__buf;
  *(int *)__buf = iVar1 + 1;
  buffer_local = (uint8_t *)(long)*(char *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1);
  if ((long)buffer_local < 0) {
    b = (ulong)buffer_local & 0x7f;
    local_34 = 7;
    while( true ) {
      iVar1 = *__buf;
      *(int *)__buf = iVar1 + 1;
      uVar2 = (ulong)*(char *)(CONCAT44(in_register_0000003c,__fd) + (long)iVar1);
      if (-1 < (long)uVar2) break;
      b = (uVar2 & 0x7f) << ((byte)local_34 & 0x3f) | b;
      local_34 = local_34 + 7;
    }
    if (uVar2 == 0) {
      if (0x3f < local_34) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"Cannot read more than 10 stop bits of negative value")
        ;
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      buffer_local = (uint8_t *)(b ^ 0xffffffffffffffff);
    }
    else {
      if (0x38 < local_34) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"Cannot read more than 9 stop bits of positive value");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      buffer_local = (uint8_t *)(b | uVar2 << ((byte)local_34 & 0x3f));
    }
  }
  return (ssize_t)buffer_local;
}

Assistant:

std::int64_t read(const std::uint8_t * buffer, std::int32_t & offset)
{
    std::int64_t l;
    if ((l = (std::int8_t)buffer[offset++]) >= 0)
        return l;
    l &= 0x7FL;
    std::int64_t b;
    int count = 7;
    while ((b = (std::int8_t)buffer[offset++]) < 0)
    {
        l |= (b & 0x7FL) << count;
        count += 7;
    }
    if (b != 0)
    {
        if (count > 56)
            throw std::logic_error("Cannot read more than 9 stop bits of positive value");
        return l | (b << count);
    }
    else
    {
        if (count > 63)
            throw std::logic_error("Cannot read more than 10 stop bits of negative value");
        return ~l;
    }
}